

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O1

void __thiscall TSMuxer::~TSMuxer(TSMuxer *this)

{
  pointer ppVar1;
  pointer pcVar2;
  pointer puVar3;
  pointer puVar4;
  pointer plVar5;
  pointer ppVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  
  if (this->m_outBuf != (uint8_t *)0x0) {
    operator_delete__(this->m_outBuf);
  }
  if ((this->m_isExternalFile == false) && (this->m_muxFile != (AbstractOutputStream *)0x0)) {
    (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[1])();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_fileNames);
  ppVar1 = (this->m_priorityData).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (ppVar1 != (pointer)0x0) {
    operator_delete(ppVar1,(long)(this->m_priorityData).
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar1);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->m_interleaveInfo);
  pcVar2 = (this->m_outFileName)._M_dataplus._M_p;
  paVar7 = &(this->m_outFileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar7) {
    operator_delete(pcVar2,paVar7->_M_allocated_capacity + 1);
  }
  puVar3 = (this->m_muxedPacketCnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->m_muxedPacketCnt).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  puVar4 = (this->m_pesData).m_data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->m_pesData).m_data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_unsigned_char>,_std::_Select1st<std::pair<const_int,_unsigned_char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_char>_>_>
  ::~_Rb_tree(&(this->m_pesType)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&(this->m_pat).pmtPids._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
  ::~_Rb_tree(&(this->m_pmt).pidList._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_TSMuxer::StreamInfo>,_std::_Select1st<std::pair<const_int,_TSMuxer::StreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
  ::~_Rb_tree(&(this->m_streamInfo)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&(this->m_extIndexToTSIndex)._M_t);
  plVar5 = (this->m_firstPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar5 != (pointer)0x0) {
    operator_delete(plVar5,(long)(this->m_firstPts).super__Vector_base<long,_std::allocator<long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)plVar5);
  }
  plVar5 = (this->m_lastPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar5 != (pointer)0x0) {
    operator_delete(plVar5,(long)(this->m_lastPts).super__Vector_base<long,_std::allocator<long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)plVar5);
  }
  ppVar6 = (this->m_m2tsDelayBlocks).
           super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar6 != (pointer)0x0) {
    operator_delete(ppVar6,(long)(this->m_m2tsDelayBlocks).
                                 super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar6);
  }
  (this->super_AbstractMuxer)._vptr_AbstractMuxer = (_func_int **)&PTR__AbstractMuxer_0023fae0;
  pcVar2 = (this->super_AbstractMuxer).m_origFileName._M_dataplus._M_p;
  paVar7 = &(this->super_AbstractMuxer).m_origFileName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar7) {
    operator_delete(pcVar2,paVar7->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

TSMuxer::~TSMuxer()
{
    delete[] m_outBuf;
    if (!m_isExternalFile)
        delete m_muxFile;
}